

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

uint32_t helper_msub32_suov(CPUTriCoreState *env,target_ulong_conflict r1,target_ulong_conflict r2,
                           target_ulong_conflict r3)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  
  iVar1 = (int)((ulong)r3 * (ulong)r1);
  uVar4 = r2 - iVar1;
  uVar4 = uVar4 * 2 ^ uVar4;
  env->PSW_USB_SAV = env->PSW_USB_SAV | uVar4;
  env->PSW_USB_AV = uVar4;
  uVar2 = r2 - iVar1;
  if ((ulong)r2 < (ulong)r3 * (ulong)r1) {
    env->PSW_USB_SV = 0x80000000;
    uVar2 = 0;
    uVar3 = 0x80000000;
  }
  else {
    uVar3 = 0;
  }
  env->PSW_USB_V = uVar3;
  return uVar2;
}

Assistant:

target_ulong helper_msub32_suov(CPUTriCoreState *env, target_ulong r1,
                                target_ulong r2, target_ulong r3)
{
    uint64_t t1 = extract64(r1, 0, 32);
    uint64_t t2 = extract64(r2, 0, 32);
    uint64_t t3 = extract64(r3, 0, 32);
    uint64_t result;
    uint64_t mul;

    mul = (t1 * t3);
    result = t2 - mul;

    env->PSW_USB_AV = result ^ result * 2u;
    env->PSW_USB_SAV |= env->PSW_USB_AV;
    /* we calculate ovf by hand here, because the multiplication can overflow on
       the host, which would give false results if we compare to less than
       zero */
    if (mul > t2) {
        env->PSW_USB_V = (1 << 31);
        env->PSW_USB_SV = (1 << 31);
        result = 0;
    } else {
        env->PSW_USB_V = 0;
    }
    return result;
}